

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::analyze_variable_scope
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler)

{
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *__k;
  key_type *__k_00;
  uint uVar1;
  key_type kVar2;
  key_type kVar3;
  size_t sVar4;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar5;
  _Hash_node_base *p_Var6;
  undefined4 uVar7;
  bool bVar8;
  uint32_t uVar9;
  __node_base_ptr p_Var10;
  SPIRBlock *pSVar11;
  __node_base_ptr p_Var12;
  _Hash_node_base *p_Var13;
  TypedID<(spirv_cross::Types)2> *pTVar14;
  SPIRType *pSVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  SPIRVariable *pSVar18;
  __node_base_ptr p_Var19;
  size_type sVar20;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  SmallVector<unsigned_int,_8UL> *pSVar21;
  SmallVector<unsigned_int,_8UL> *pSVar22;
  ulong uVar23;
  __hash_code __code;
  __node_base_ptr p_Var24;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var25;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var26;
  long *plVar27;
  key_type kVar28;
  long lVar29;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var30;
  undefined8 *puVar31;
  TypedID<(spirv_cross::Types)6> *block_id;
  TypedID<(spirv_cross::Types)6> *__k_01;
  SPIRFunction *pSVar32;
  __node_base _Var33;
  bool bVar34;
  bool static_loop_init;
  uint32_t dominating_block;
  __hashtable *__h_1;
  __hashtable *__h;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *__range1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_blocks;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  potential_loop_variables;
  bool local_f5;
  key_type local_f4;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_f0;
  SPIRBlock *local_e8;
  SPIRFunction *local_e0;
  anon_class_16_2_2fc8764d local_d8;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_c8;
  CFG *local_c0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_b8;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_b0;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a8;
  undefined1 local_a0 [56];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_e8 = (SPIRBlock *)handler;
  traverse_all_reachable_opcodes(this,entry,&handler->super_OpcodeHandler);
  uVar1 = (entry->super_IVariant).self.id;
  p_Var10 = (this->function_cfgs)._M_h._M_buckets
            [(ulong)uVar1 % (this->function_cfgs)._M_h._M_bucket_count];
  for (p_Var24 = p_Var10->_M_nxt; uVar1 != *(uint *)&p_Var24[1]._M_nxt; p_Var24 = p_Var24->_M_nxt) {
    p_Var10 = p_Var24;
  }
  local_c0 = (CFG *)p_Var10->_M_nxt[2]._M_nxt;
  local_a8 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&local_e8->next_block;
  analyze_parameter_preservation
            (this,entry,local_c0,
             (unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)local_a8,
             (unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)&(local_e8->phi_variables).buffer_capacity);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  sVar4 = (entry->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size
  ;
  local_e0 = entry;
  if (sVar4 != 0) {
    __k_01 = (entry->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    lVar29 = sVar4 << 2;
    do {
      pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                          ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + __k_01->id);
      p_Var12 = ::std::
                _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_before_node
                          (&(this->ir).continue_block_to_loop_header._M_h,
                           (ulong)__k_01->id %
                           (this->ir).continue_block_to_loop_header._M_h._M_bucket_count,__k_01,
                           (ulong)__k_01->id);
      if (p_Var12 == (__node_base_ptr)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var12->_M_nxt;
      }
      if (((p_Var13 == (_Hash_node_base *)0x0) ||
          (uVar9 = *(uint32_t *)((long)&p_Var13[1]._M_nxt + 4), uVar9 == __k_01->id)) &&
         (uVar9 = CFG::find_loop_dominator(local_c0,__k_01->id), uVar9 == __k_01->id)) {
        (pSVar11->loop_dominator).id = 0xffffffff;
      }
      else {
        (pSVar11->loop_dominator).id = uVar9;
      }
      __k_01 = __k_01 + 1;
      lVar29 = lVar29 + -4;
    } while (lVar29 != 0);
  }
  p_Var26 = *(_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              **)&local_e8->condition;
  if (p_Var26 !=
      (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       *)0x0) {
    pSVar32 = local_e0;
    do {
      pTVar14 = (pSVar32->local_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      local_a0._0_4_ = *(undefined4 *)(p_Var26 + 8);
      pTVar14 = ::std::
                __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                          (pTVar14,pTVar14 + (pSVar32->local_variables).
                                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                             .buffer_size,(DominatorBuilder *)local_a0);
      if (pTVar14 !=
          (pSVar32->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          ptr + (pSVar32->local_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size) {
        DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_a0,local_c0);
        __k = p_Var26 + 8;
        uVar9 = expression_type_id(this,*(uint32_t *)__k);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar9);
        p_Var25 = p_Var26 + 0x20;
        local_c8 = p_Var26;
        while (p_Var25 = *(_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           **)p_Var25,
              p_Var25 !=
              (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)0x0) {
          if (((this->ir).block_meta.super_VectorView<unsigned_char>.ptr[*(uint *)(p_Var25 + 8)] & 2
              ) != 0) {
            local_d8.blocks = (mapped_type *)CONCAT44(local_d8.blocks._4_4_,*(uint *)(p_Var25 + 8));
            pmVar16 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&(this->ir).continue_block_to_loop_header,
                                   (key_type *)&local_d8);
            DominatorBuilder::add_block((DominatorBuilder *)local_a0,pmVar16->id);
            if (((pSVar15->vecsize == 1) && (pSVar15->columns == 1)) &&
               ((*(int *)&(pSVar15->super_IVariant).field_0xc != 0xf &&
                ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 0)))) {
              pmVar17 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_68,(key_type *)__k);
              *pmVar17 = -(uint)(*pmVar17 != 0) | *(uint *)(p_Var25 + 8);
            }
          }
          DominatorBuilder::add_block((DominatorBuilder *)local_a0,*(uint32_t *)(p_Var25 + 8));
        }
        DominatorBuilder::lift_continue_block_dominator((DominatorBuilder *)local_a0);
        p_Var26 = local_c8;
        p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_a0._8_8_ & 0xffffffff);
        if ((p_Var30 !=
             (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)0x0) &&
           (pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)__k), pSVar18->phi_variable == false)) {
          local_f0 = p_Var30;
          pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               (long)p_Var30);
          bVar8 = may_read_undefined_variable_in_block(this,pSVar11,*(uint32_t *)__k);
          p_Var30 = local_f0;
          if (bVar8) {
            while (uVar23 = (ulong)(pSVar11->loop_dominator).id, uVar23 != 0xffffffff) {
              pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                   uVar23);
            }
            uVar9 = (pSVar11->super_IVariant).self.id;
            p_Var30 = local_f0;
            if (uVar9 != (uint32_t)local_f0) {
              DominatorBuilder::add_block((DominatorBuilder *)local_a0,uVar9);
              p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)(local_a0._8_8_ & 0xffffffff);
            }
          }
        }
        pSVar32 = local_e0;
        if ((int)p_Var30 != 0) {
          local_f0 = p_Var30;
          pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               ((ulong)p_Var30 & 0xffffffff));
          kVar2 = *(key_type *)__k;
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                    (&pSVar11->dominated_variables,
                     (pSVar11->dominated_variables).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1)
          ;
          sVar4 = (pSVar11->dominated_variables).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
          (pSVar11->dominated_variables).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr[sVar4].id = kVar2;
          (pSVar11->dominated_variables).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size = sVar4 + 1;
          pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)__k);
          (pSVar18->dominator).id = (uint32_t)local_f0;
          p_Var26 = local_c8;
          pSVar32 = local_e0;
        }
      }
      p_Var26 = *(_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  **)p_Var26;
    } while (p_Var26 !=
             (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)0x0);
  }
  plVar27 = *(long **)((local_e8->ops).stack_storage.aligned_char + 0x10);
  if (plVar27 != (long *)0x0) {
    p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)((local_e8->ops).stack_storage.aligned_char + 0x38);
    local_c8 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->ir).continue_block_to_loop_header;
    local_e0 = (SPIRFunction *)
               &(local_e8->declare_temporary).
                super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                .buffer_size;
    local_b0 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->hoisted_temporaries;
    local_b8 = &(this->forced_temporaries)._M_h;
    local_f0 = p_Var30;
    do {
      __k_00 = (key_type *)(plVar27 + 1);
      p_Var19 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_before_node
                          (p_Var30,(ulong)*(uint *)(plVar27 + 1) %
                                   *(ulong *)((local_e8->ops).stack_storage.aligned_char + 0x40),
                           __k_00,(ulong)*(uint *)(plVar27 + 1));
      if (p_Var19 == (__node_base_ptr)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var19->_M_nxt;
      }
      if ((p_Var13 != (_Hash_node_base *)0x0) &&
         ((pSVar15 = Variant::get<spirv_cross::SPIRType>
                               ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                *(uint *)((long)&p_Var13[1]._M_nxt + 4)), pSVar15->pointer != false
          || (*(int *)&(pSVar15->super_IVariant).field_0xc - 0x13U < 0xfffffffd)))) {
        DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_a0,local_c0);
        bVar8 = false;
        for (puVar31 = (undefined8 *)plVar27[4]; puVar31 != (undefined8 *)0x0;
            puVar31 = (undefined8 *)*puVar31) {
          DominatorBuilder::add_block((DominatorBuilder *)local_a0,*(uint32_t *)(puVar31 + 1));
          if ((plVar27[5] != 1) &&
             (((this->ir).block_meta.super_VectorView<unsigned_char>.ptr[*(uint *)(puVar31 + 1)] & 2
              ) != 0)) {
            local_d8.blocks = (mapped_type *)CONCAT44(local_d8.blocks._4_4_,*(uint *)(puVar31 + 1));
            pmVar16 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_c8,(key_type *)&local_d8);
            pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                                ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                 pmVar16->id);
            if (pSVar11->merge != MergeLoop) {
              __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                            ,0xdaa,
                            "void spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                           );
            }
            bVar8 = true;
            DominatorBuilder::add_block
                      ((DominatorBuilder *)local_a0,(pSVar11->super_IVariant).self.id);
          }
        }
        uVar7 = local_a0._8_4_;
        local_f4.id = local_a0._8_4_;
        if (plVar27[5] == 1) {
          bVar34 = false;
        }
        else {
          pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               (local_a0._8_8_ & 0xffffffff));
          bVar34 = uVar7 == (pSVar11->continue_block).id && pSVar11->merge == MergeLoop;
        }
        p_Var30 = local_f0;
        if (local_f4.id != 0) {
          sVar20 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)(plVar27 + 2),&local_f4.id);
          if ((bool)(~bVar34 & sVar20 != 0)) {
            p_Var30 = local_f0;
            if (1 < (ulong)plVar27[5]) {
              pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                   local_f4.id);
              pmVar17 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_f0,__k_00);
              SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
              ::reserve(&pSVar11->potential_declare_temporary,
                        (pSVar11->potential_declare_temporary).
                        super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                        .buffer_size + 1);
              ppVar5 = (pSVar11->potential_declare_temporary).
                       super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                       .ptr;
              sVar4 = (pSVar11->potential_declare_temporary).
                      super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                      .buffer_size;
              ppVar5[sVar4].first.id = *pmVar17;
              ppVar5[sVar4].second.id = *__k_00;
              (pSVar11->potential_declare_temporary).
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              .buffer_size = sVar4 + 1;
              p_Var30 = local_f0;
            }
          }
          else {
            sVar20 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_e0,__k_00);
            if (sVar20 == 0) {
              local_d8.blocks = (mapped_type *)local_b0;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        (local_b0,__k_00,&local_d8);
              local_d8.blocks = (mapped_type *)local_b8;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_b8,__k_00,&local_d8);
              pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                   local_f4.id);
              pmVar17 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_f0,__k_00);
              SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
              ::reserve(&pSVar11->declare_temporary,
                        (pSVar11->declare_temporary).
                        super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                        .buffer_size + 1);
              ppVar5 = (pSVar11->declare_temporary).
                       super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                       .ptr;
              sVar4 = (pSVar11->declare_temporary).
                      super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                      .buffer_size;
              ppVar5[sVar4].first.id = *pmVar17;
              ppVar5[sVar4].second.id = *__k_00;
              (pSVar11->declare_temporary).
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              .buffer_size = sVar4 + 1;
              p_Var30 = local_f0;
            }
            else {
              p_Var30 = local_f0;
              if (bVar8) {
                pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                                    ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                     local_f4.id);
                if (pSVar11->merge != MergeLoop) {
                  __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                                ,0xdd2,
                                "void spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                               );
                }
                pSVar11->complex_continue = true;
                p_Var30 = local_f0;
              }
            }
          }
        }
      }
      plVar27 = (long *)*plVar27;
    } while (plVar27 != (long *)0x0);
  }
  local_a0._0_8_ = local_a0 + 0x30;
  local_a0._8_8_ = 1;
  local_a0._16_8_ = (_Hash_node_base *)0x0;
  local_a0._24_8_ = 0;
  local_a0._32_4_ = 1.0;
  local_a0._40_8_ = 0;
  local_a0._48_8_ = (__node_base_ptr)0x0;
  if ((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       *)local_68._M_before_begin._M_nxt !=
      (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       *)0x0) {
    local_f0 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&(this->ir).continue_block_to_loop_header;
    _Var33._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)((long)_Var33._M_nxt + 8));
      uVar9 = (pSVar18->dominator).id;
      local_f4.id = *(uint32_t *)((long)_Var33._M_nxt + 0xc);
      if ((1 < local_f4.id + 1) && (uVar9 != 0)) {
        p_Var12 = ::std::
                  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_f0,
                             (ulong)local_f4.id %
                             (this->ir).continue_block_to_loop_header._M_h._M_bucket_count,&local_f4
                             ,(ulong)local_f4.id);
        if (p_Var12 == (__node_base_ptr)0x0) {
          p_Var13 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var13 = p_Var12->_M_nxt;
        }
        if (p_Var13 == (_Hash_node_base *)0x0) {
          pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               local_f4.id);
          kVar28.id = local_f4.id;
          if ((pSVar11->continue_block).id != local_f4.id) {
            kVar28.id = 0;
          }
        }
        else {
          kVar28.id = *(uint *)((long)&p_Var13[1]._M_nxt + 4);
        }
        if (kVar28.id == 0) {
          __assert_fail("header",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                        ,0xe10,
                        "void spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                       );
        }
        local_e8 = Variant::get<spirv_cross::SPIRBlock>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + kVar28.id)
        ;
        this_00 = &::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_a8,(key_type *)((long)_Var33._M_nxt + 8))->_M_h;
        local_d8.blocks = (mapped_type *)CONCAT44(local_d8.blocks._4_4_,kVar28.id);
        local_e0 = (SPIRFunction *)((long)_Var33._M_nxt + 8);
        local_c8 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)_Var33._M_nxt;
        sVar20 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(this_00,(key_type *)&local_d8);
        bVar8 = sVar20 != 0;
        local_f5 = true;
        do {
          if (uVar9 == kVar28.id) break;
          local_d8.blocks = (mapped_type *)CONCAT44(local_d8.blocks._4_4_,uVar9);
          sVar20 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(this_00,(key_type *)&local_d8);
          if (sVar20 != 0) {
            bVar8 = true;
          }
          pSVar21 = CFG::get_succeeding_edges(local_c0,uVar9);
          if ((((pSVar21->super_VectorView<unsigned_int>).buffer_size == 1) &&
              (pSVar22 = CFG::get_preceding_edges
                                   (local_c0,*(pSVar21->super_VectorView<unsigned_int>).ptr),
              (pSVar22->super_VectorView<unsigned_int>).buffer_size == 1)) &&
             (*(pSVar22->super_VectorView<unsigned_int>).ptr == uVar9)) {
            uVar9 = *(pSVar21->super_VectorView<unsigned_int>).ptr;
            bVar34 = true;
          }
          else {
            local_f5 = false;
            bVar34 = false;
          }
        } while (bVar34);
        _Var33._M_nxt = (_Hash_node_base *)local_c8;
        if ((local_f5 == true) && (p_Var13 = (_Hash_node_base *)local_a0._16_8_, bVar8)) {
          while (p_Var13 != (_Hash_node_base *)0x0) {
            p_Var6 = p_Var13->_M_nxt;
            operator_delete(p_Var13);
            p_Var13 = p_Var6;
          }
          memset((void *)local_a0._0_8_,0,local_a0._8_8_ << 3);
          local_a0._16_8_ = (_Hash_node_base *)0x0;
          local_a0._24_8_ = 0;
          local_d8.static_loop_init = &local_f5;
          local_d8.blocks = (mapped_type *)this_00;
          CFG::
          walk_from<spirv_cross::Compiler::analyze_variable_scope(spirv_cross::SPIRFunction&,spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                    (local_c0,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_a0,(local_e8->merge_block).id,&local_d8);
          pSVar32 = local_e0;
          pSVar11 = local_e8;
          _Var33._M_nxt = (_Hash_node_base *)local_c8;
          if (local_f5 != false) {
            kVar3 = *(key_type *)&(local_e0->super_IVariant)._vptr_IVariant;
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                      (&local_e8->loop_variables,
                       (local_e8->loop_variables).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size +
                       1);
            pTVar14 = (pSVar11->loop_variables).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
            sVar4 = (pSVar11->loop_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
            pTVar14[sVar4].id = kVar3;
            uVar23 = sVar4 + 1;
            (pSVar11->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .buffer_size = uVar23;
            if (uVar23 != 0) {
              lVar29 = 0x3f;
              if (uVar23 != 0) {
                for (; uVar23 >> lVar29 == 0; lVar29 = lVar29 + -1) {
                }
              }
              ::std::
              __introsort_loop<spirv_cross::TypedID<(spirv_cross::Types)2>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pTVar14,pTVar14 + uVar23,((uint)lVar29 ^ 0x3f) * 2 ^ 0x7e);
              ::std::
              __final_insertion_sort<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_less_iter>
                        (pTVar14,pTVar14 + uVar23);
            }
            pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(pSVar32->super_IVariant)._vptr_IVariant);
            pSVar18->loop_variable = true;
            _Var33._M_nxt = (_Hash_node_base *)local_c8;
          }
        }
      }
      _Var33._M_nxt = (_Var33._M_nxt)->_M_nxt;
    } while ((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)_Var33._M_nxt !=
             (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)0x0);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a0);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void Compiler::analyze_variable_scope(SPIRFunction &entry, AnalyzeVariableScopeAccessHandler &handler)
{
	// First, we map out all variable access within a function.
	// Essentially a map of block -> { variables accessed in the basic block }
	traverse_all_reachable_opcodes(entry, handler);

	auto &cfg = *function_cfgs.find(entry.self)->second;

	// Analyze if there are parameters which need to be implicitly preserved with an "in" qualifier.
	analyze_parameter_preservation(entry, cfg, handler.accessed_variables_to_block,
	                               handler.complete_write_variables_to_block);

	unordered_map<uint32_t, uint32_t> potential_loop_variables;

	// Find the loop dominator block for each block.
	for (auto &block_id : entry.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);

		auto itr = ir.continue_block_to_loop_header.find(block_id);
		if (itr != end(ir.continue_block_to_loop_header) && itr->second != block_id)
		{
			// Continue block might be unreachable in the CFG, but we still like to know the loop dominator.
			// Edge case is when continue block is also the loop header, don't set the dominator in this case.
			block.loop_dominator = itr->second;
		}
		else
		{
			uint32_t loop_dominator = cfg.find_loop_dominator(block_id);
			if (loop_dominator != block_id)
				block.loop_dominator = loop_dominator;
			else
				block.loop_dominator = SPIRBlock::NoDominator;
		}
	}

	// For each variable which is statically accessed.
	for (auto &var : handler.accessed_variables_to_block)
	{
		// Only deal with variables which are considered local variables in this function.
		if (find(begin(entry.local_variables), end(entry.local_variables), VariableID(var.first)) ==
		    end(entry.local_variables))
			continue;

		DominatorBuilder builder(cfg);
		auto &blocks = var.second;
		auto &type = expression_type(var.first);

		// Figure out which block is dominating all accesses of those variables.
		for (auto &block : blocks)
		{
			// If we're accessing a variable inside a continue block, this variable might be a loop variable.
			// We can only use loop variables with scalars, as we cannot track static expressions for vectors.
			if (is_continue(block))
			{
				// Potentially awkward case to check for.
				// We might have a variable inside a loop, which is touched by the continue block,
				// but is not actually a loop variable.
				// The continue block is dominated by the inner part of the loop, which does not make sense in high-level
				// language output because it will be declared before the body,
				// so we will have to lift the dominator up to the relevant loop header instead.
				builder.add_block(ir.continue_block_to_loop_header[block]);

				// Arrays or structs cannot be loop variables.
				if (type.vecsize == 1 && type.columns == 1 && type.basetype != SPIRType::Struct && type.array.empty())
				{
					// The variable is used in multiple continue blocks, this is not a loop
					// candidate, signal that by setting block to -1u.
					auto &potential = potential_loop_variables[var.first];

					if (potential == 0)
						potential = block;
					else
						potential = ~(0u);
				}
			}
			builder.add_block(block);
		}

		builder.lift_continue_block_dominator();

		// Add it to a per-block list of variables.
		BlockID dominating_block = builder.get_dominator();

		// For variables whose dominating block is inside a loop, there is a risk that these variables
		// actually need to be preserved across loop iterations. We can express this by adding
		// a "read" access to the loop header.
		// In the dominating block, we must see an OpStore or equivalent as the first access of an OpVariable.
		// Should that fail, we look for the outermost loop header and tack on an access there.
		// Phi nodes cannot have this problem.
		if (dominating_block)
		{
			auto &variable = get<SPIRVariable>(var.first);
			if (!variable.phi_variable)
			{
				auto *block = &get<SPIRBlock>(dominating_block);
				bool preserve = may_read_undefined_variable_in_block(*block, var.first);
				if (preserve)
				{
					// Find the outermost loop scope.
					while (block->loop_dominator != BlockID(SPIRBlock::NoDominator))
						block = &get<SPIRBlock>(block->loop_dominator);

					if (block->self != dominating_block)
					{
						builder.add_block(block->self);
						dominating_block = builder.get_dominator();
					}
				}
			}
		}

		// If all blocks here are dead code, this will be 0, so the variable in question
		// will be completely eliminated.
		if (dominating_block)
		{
			auto &block = get<SPIRBlock>(dominating_block);
			block.dominated_variables.push_back(var.first);
			get<SPIRVariable>(var.first).dominator = dominating_block;
		}
	}

	for (auto &var : handler.accessed_temporaries_to_block)
	{
		auto itr = handler.result_id_to_type.find(var.first);

		if (itr == end(handler.result_id_to_type))
		{
			// We found a false positive ID being used, ignore.
			// This should probably be an assert.
			continue;
		}

		// There is no point in doing domination analysis for opaque types.
		auto &type = get<SPIRType>(itr->second);
		if (type_is_opaque_value(type))
			continue;

		DominatorBuilder builder(cfg);
		bool force_temporary = false;
		bool used_in_header_hoisted_continue_block = false;

		// Figure out which block is dominating all accesses of those temporaries.
		auto &blocks = var.second;
		for (auto &block : blocks)
		{
			builder.add_block(block);

			if (blocks.size() != 1 && is_continue(block))
			{
				// The risk here is that inner loop can dominate the continue block.
				// Any temporary we access in the continue block must be declared before the loop.
				// This is moot for complex loops however.
				auto &loop_header_block = get<SPIRBlock>(ir.continue_block_to_loop_header[block]);
				assert(loop_header_block.merge == SPIRBlock::MergeLoop);
				builder.add_block(loop_header_block.self);
				used_in_header_hoisted_continue_block = true;
			}
		}

		uint32_t dominating_block = builder.get_dominator();

		if (blocks.size() != 1 && is_single_block_loop(dominating_block))
		{
			// Awkward case, because the loop header is also the continue block,
			// so hoisting to loop header does not help.
			force_temporary = true;
		}

		if (dominating_block)
		{
			// If we touch a variable in the dominating block, this is the expected setup.
			// SPIR-V normally mandates this, but we have extra cases for temporary use inside loops.
			bool first_use_is_dominator = blocks.count(dominating_block) != 0;

			if (!first_use_is_dominator || force_temporary)
			{
				if (handler.access_chain_expressions.count(var.first))
				{
					// Exceptionally rare case.
					// We cannot declare temporaries of access chains (except on MSL perhaps with pointers).
					// Rather than do that, we force the indexing expressions to be declared in the right scope by
					// tracking their usage to that end. There is no temporary to hoist.
					// However, we still need to observe declaration order of the access chain.

					if (used_in_header_hoisted_continue_block)
					{
						// For this scenario, we used an access chain inside a continue block where we also registered an access to header block.
						// This is a problem as we need to declare an access chain properly first with full definition.
						// We cannot use temporaries for these expressions,
						// so we must make sure the access chain is declared ahead of time.
						// Force a complex for loop to deal with this.
						// TODO: Out-of-order declaring for loops where continue blocks are emitted last might be another option.
						auto &loop_header_block = get<SPIRBlock>(dominating_block);
						assert(loop_header_block.merge == SPIRBlock::MergeLoop);
						loop_header_block.complex_continue = true;
					}
				}
				else
				{
					// This should be very rare, but if we try to declare a temporary inside a loop,
					// and that temporary is used outside the loop as well (spirv-opt inliner likes this)
					// we should actually emit the temporary outside the loop.
					hoisted_temporaries.insert(var.first);
					forced_temporaries.insert(var.first);

					auto &block_temporaries = get<SPIRBlock>(dominating_block).declare_temporary;
					block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
				}
			}
			else if (blocks.size() > 1)
			{
				// Keep track of the temporary as we might have to declare this temporary.
				// This can happen if the loop header dominates a temporary, but we have a complex fallback loop.
				// In this case, the header is actually inside the for (;;) {} block, and we have problems.
				// What we need to do is hoist the temporaries outside the for (;;) {} block in case the header block
				// declares the temporary.
				auto &block_temporaries = get<SPIRBlock>(dominating_block).potential_declare_temporary;
				block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
			}
		}
	}

	unordered_set<uint32_t> seen_blocks;

	// Now, try to analyze whether or not these variables are actually loop variables.
	for (auto &loop_variable : potential_loop_variables)
	{
		auto &var = get<SPIRVariable>(loop_variable.first);
		auto dominator = var.dominator;
		BlockID block = loop_variable.second;

		// The variable was accessed in multiple continue blocks, ignore.
		if (block == BlockID(~(0u)) || block == BlockID(0))
			continue;

		// Dead code.
		if (dominator == ID(0))
			continue;

		BlockID header = 0;

		// Find the loop header for this block if we are a continue block.
		{
			auto itr = ir.continue_block_to_loop_header.find(block);
			if (itr != end(ir.continue_block_to_loop_header))
			{
				header = itr->second;
			}
			else if (get<SPIRBlock>(block).continue_block == block)
			{
				// Also check for self-referential continue block.
				header = block;
			}
		}

		assert(header);
		auto &header_block = get<SPIRBlock>(header);
		auto &blocks = handler.accessed_variables_to_block[loop_variable.first];

		// If a loop variable is not used before the loop, it's probably not a loop variable.
		bool has_accessed_variable = blocks.count(header) != 0;

		// Now, there are two conditions we need to meet for the variable to be a loop variable.
		// 1. The dominating block must have a branch-free path to the loop header,
		// this way we statically know which expression should be part of the loop variable initializer.

		// Walk from the dominator, if there is one straight edge connecting
		// dominator and loop header, we statically know the loop initializer.
		bool static_loop_init = true;
		while (dominator != header)
		{
			if (blocks.count(dominator) != 0)
				has_accessed_variable = true;

			auto &succ = cfg.get_succeeding_edges(dominator);
			if (succ.size() != 1)
			{
				static_loop_init = false;
				break;
			}

			auto &pred = cfg.get_preceding_edges(succ.front());
			if (pred.size() != 1 || pred.front() != dominator)
			{
				static_loop_init = false;
				break;
			}

			dominator = succ.front();
		}

		if (!static_loop_init || !has_accessed_variable)
			continue;

		// The second condition we need to meet is that no access after the loop
		// merge can occur. Walk the CFG to see if we find anything.

		seen_blocks.clear();
		cfg.walk_from(seen_blocks, header_block.merge_block, [&](uint32_t walk_block) -> bool {
			// We found a block which accesses the variable outside the loop.
			if (blocks.find(walk_block) != end(blocks))
				static_loop_init = false;
			return true;
		});

		if (!static_loop_init)
			continue;

		// We have a loop variable.
		header_block.loop_variables.push_back(loop_variable.first);
		// Need to sort here as variables come from an unordered container, and pushing stuff in wrong order
		// will break reproducability in regression runs.
		sort(begin(header_block.loop_variables), end(header_block.loop_variables));
		get<SPIRVariable>(loop_variable.first).loop_variable = true;
	}
}